

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RobotDynamics.cpp
# Opt level: O0

void __thiscall RobotDynamics::~RobotDynamics(RobotDynamics *this)

{
  RobotDynamics *this_local;
  
  std::vector<double,_std::allocator<double>_>::~vector(&this->friction);
  std::vector<double,_std::allocator<double>_>::~vector(&this->damping);
  std::vector<double,_std::allocator<double>_>::~vector(&this->m);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::~vector(&this->I);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector(&this->PC);
  return;
}

Assistant:

RobotDynamics::~RobotDynamics() {}